

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_elements_transaction.cpp
# Opt level: O1

uint32_t __thiscall
cfd::ConfidentialTransactionContext::AddTxOut
          (ConfidentialTransactionContext *this,ElementsConfidentialAddress *address,Amount *value,
          ConfidentialAssetId *asset,bool remove_nonce)

{
  pointer puVar1;
  uint32_t uVar2;
  undefined7 in_register_00000081;
  ByteData local_a8;
  ConfidentialNonce local_90;
  Script local_68;
  
  cfd::core::ByteData::ByteData(&local_a8);
  if ((int)CONCAT71(in_register_00000081,remove_nonce) == 0) {
    cfd::core::ElementsConfidentialAddress::GetConfidentialKey();
    cfd::core::Pubkey::GetData();
    puVar1 = local_a8.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
             _M_impl.super__Vector_impl_data._M_start;
    local_a8.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)local_68._vptr_Script;
    local_a8.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish =
         local_68.script_data_.data_.
         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
         super__Vector_impl_data._M_start;
    local_a8.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         local_68.script_data_.data_.
         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
         super__Vector_impl_data._M_finish;
    local_68._vptr_Script = (_func_int **)0x0;
    local_68.script_data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_68.script_data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    if ((_func_int **)puVar1 != (_func_int **)0x0) {
      operator_delete(puVar1);
    }
    if (local_68._vptr_Script != (_func_int **)0x0) {
      operator_delete(local_68._vptr_Script);
    }
    if (local_90._vptr_ConfidentialNonce != (_func_int **)0x0) {
      operator_delete(local_90._vptr_ConfidentialNonce);
    }
  }
  cfd::core::ElementsConfidentialAddress::GetLockingScript();
  cfd::core::ConfidentialNonce::ConfidentialNonce(&local_90,&local_a8);
  uVar2 = cfd::core::ConfidentialTransaction::AddTxOut
                    ((Amount *)this,(ConfidentialAssetId *)value,(Script *)asset,
                     (ConfidentialNonce *)&local_68);
  local_90._vptr_ConfidentialNonce = (_func_int **)&PTR__ConfidentialNonce_002b32e0;
  if (local_90.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
      .super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_90.data_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  core::Script::~Script(&local_68);
  if ((_func_int **)
      local_a8.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (_func_int **)0x0) {
    operator_delete(local_a8.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  return uVar2;
}

Assistant:

uint32_t ConfidentialTransactionContext::AddTxOut(
    const ElementsConfidentialAddress& address, const Amount& value,
    const ConfidentialAssetId& asset, bool remove_nonce) {
  ByteData nonce;
  if (!remove_nonce) {
    nonce = address.GetConfidentialKey().GetData();
  }
  return AddTxOut(
      value, asset, address.GetLockingScript(), ConfidentialNonce(nonce));
}